

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadDigits
          (BigUnsigned<84> *this,char *begin,char *end,int significant_digits)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_59 [9];
  char *decimal_point;
  int local_48;
  uint32_t uStack_44;
  char digit;
  int digits_queued;
  uint32_t queued;
  int exponent_adjust;
  char *dp;
  byte local_25;
  int dropped_digits;
  bool after_decimal_point;
  char *pcStack_20;
  int significant_digits_local;
  char *end_local;
  char *begin_local;
  BigUnsigned<84> *this_local;
  
  dropped_digits = significant_digits;
  pcStack_20 = end;
  end_local = begin;
  begin_local = (char *)this;
  iVar1 = Digits10();
  if (iVar1 + 1 < significant_digits) {
    __assert_fail("significant_digits <= Digits10() + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/charconv_bigint.cc"
                  ,0xc3,
                  "int absl::strings_internal::BigUnsigned<84>::ReadDigits(const char *, const char *, int) [max_words = 84]"
                 );
  }
  SetToZero(this);
  local_25 = 0;
  while( true ) {
    bVar3 = false;
    if (end_local < pcStack_20) {
      bVar3 = *end_local == '0';
    }
    if (!bVar3) break;
    end_local = end_local + 1;
  }
  dp._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (end_local < pcStack_20) {
      pcVar2 = std::prev<char_const*>(pcStack_20,1);
      bVar3 = *pcVar2 == '0';
    }
    if (!bVar3) break;
    pcStack_20 = pcStack_20 + -1;
    dp._4_4_ = dp._4_4_ + 1;
  }
  if ((end_local < pcStack_20) && (pcVar2 = std::prev<char_const*>(pcStack_20,1), *pcVar2 == '.')) {
    dp._4_4_ = 0;
    while( true ) {
      pcStack_20 = pcStack_20 + -1;
      bVar3 = false;
      if (end_local < pcStack_20) {
        pcVar2 = std::prev<char_const*>(pcStack_20,1);
        bVar3 = *pcVar2 == '0';
      }
      if (!bVar3) break;
      dp._4_4_ = dp._4_4_ + 1;
    }
  }
  else if (dp._4_4_ != 0) {
    queued._3_1_ = 0x2e;
    _exponent_adjust = std::find<char_const*,char>(end_local,pcStack_20,(char *)((long)&queued + 3))
    ;
    if (_exponent_adjust != pcStack_20) {
      dp._4_4_ = 0;
    }
  }
  digits_queued = dp._4_4_;
  uStack_44 = 0;
  local_48 = 0;
  for (; end_local != pcStack_20 && 0 < dropped_digits; end_local = end_local + 1) {
    if (*end_local == '.') {
      local_25 = 1;
    }
    else {
      if ((local_25 & 1) != 0) {
        digits_queued = digits_queued + -1;
      }
      decimal_point._7_1_ = *end_local + -0x30;
      dropped_digits = dropped_digits + -1;
      if (((dropped_digits == 0) &&
          (pcVar2 = std::next<char_const*>(end_local,1), pcVar2 != pcStack_20)) &&
         ((decimal_point._7_1_ == '\0' || (decimal_point._7_1_ == '\x05')))) {
        decimal_point._7_1_ = decimal_point._7_1_ + '\x01';
      }
      uStack_44 = uStack_44 * 10 + (int)decimal_point._7_1_;
      local_48 = local_48 + 1;
      if (local_48 == 9) {
        MultiplyBy(this,1000000000);
        AddWithCarry(this,0,uStack_44);
        local_48 = 0;
        uStack_44 = 0;
      }
    }
  }
  if (local_48 != 0) {
    MultiplyBy(this,*(uint32_t *)(kTenToNth + (long)local_48 * 4));
    AddWithCarry(this,0,uStack_44);
  }
  if ((end_local < pcStack_20) && ((local_25 & 1) == 0)) {
    local_59[0] = '.';
    pcVar2 = std::find<char_const*,char>(end_local,pcStack_20,local_59);
    digits_queued = digits_queued + ((int)pcVar2 - (int)end_local);
  }
  return digits_queued;
}

Assistant:

int BigUnsigned<max_words>::ReadDigits(const char* begin, const char* end,
                                       int significant_digits) {
  assert(significant_digits <= Digits10() + 1);
  SetToZero();

  bool after_decimal_point = false;
  // Discard any leading zeroes before the decimal point
  while (begin < end && *begin == '0') {
    ++begin;
  }
  int dropped_digits = 0;
  // Discard any trailing zeroes.  These may or may not be after the decimal
  // point.
  while (begin < end && *std::prev(end) == '0') {
    --end;
    ++dropped_digits;
  }
  if (begin < end && *std::prev(end) == '.') {
    // If the string ends in '.', either before or after dropping zeroes, then
    // drop the decimal point and look for more digits to drop.
    dropped_digits = 0;
    --end;
    while (begin < end && *std::prev(end) == '0') {
      --end;
      ++dropped_digits;
    }
  } else if (dropped_digits) {
    // We dropped digits, and aren't sure if they're before or after the decimal
    // point.  Figure that out now.
    const char* dp = std::find(begin, end, '.');
    if (dp != end) {
      // The dropped trailing digits were after the decimal point, so don't
      // count them.
      dropped_digits = 0;
    }
  }
  // Any non-fraction digits we dropped need to be accounted for in our exponent
  // adjustment.
  int exponent_adjust = dropped_digits;

  uint32_t queued = 0;
  int digits_queued = 0;
  for (; begin != end && significant_digits > 0; ++begin) {
    if (*begin == '.') {
      after_decimal_point = true;
      continue;
    }
    if (after_decimal_point) {
      // For each fractional digit we emit in our parsed integer, adjust our
      // decimal exponent to compensate.
      --exponent_adjust;
    }
    char digit = (*begin - '0');
    --significant_digits;
    if (significant_digits == 0 && std::next(begin) != end &&
        (digit == 0 || digit == 5)) {
      // If this is the very last significant digit, but insignificant digits
      // remain, we know that the last of those remaining significant digits is
      // nonzero.  (If it wasn't, we would have stripped it before we got here.)
      // So if this final digit is a 0 or 5, adjust it upward by 1.
      //
      // This adjustment is what allows incredibly large mantissas ending in
      // 500000...000000000001 to correctly round up, rather than to nearest.
      ++digit;
    }
    queued = 10 * queued + static_cast<uint32_t>(digit);
    ++digits_queued;
    if (digits_queued == kMaxSmallPowerOfTen) {
      MultiplyBy(kTenToNth[kMaxSmallPowerOfTen]);
      AddWithCarry(0, queued);
      queued = digits_queued = 0;
    }
  }
  // Encode any remaining digits.
  if (digits_queued) {
    MultiplyBy(kTenToNth[digits_queued]);
    AddWithCarry(0, queued);
  }

  // If any insignificant digits remain, we will drop them.  But if we have not
  // yet read the decimal point, then we have to adjust the exponent to account
  // for the dropped digits.
  if (begin < end && !after_decimal_point) {
    // This call to std::find will result in a pointer either to the decimal
    // point, or to the end of our buffer if there was none.
    //
    // Either way, [begin, decimal_point) will contain the set of dropped digits
    // that require an exponent adjustment.
    const char* decimal_point = std::find(begin, end, '.');
    exponent_adjust += (decimal_point - begin);
  }
  return exponent_adjust;
}